

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_switch(Curl_easy *data,connectdata *conn,int sockindex)

{
  _Bool local_35;
  CURLcode local_34;
  _Bool done;
  Curl_cfilter *pCStack_30;
  CURLcode result;
  Curl_cfilter *cf;
  connectdata *pcStack_20;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf._4_4_ = sockindex;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  local_34 = http2_cfilter_add(&stack0xffffffffffffffd0,data,conn,sockindex);
  data_local._4_4_ = local_34;
  if ((local_34 == CURLE_OK) &&
     (local_34 = cf_h2_ctx_init(pCStack_30,(Curl_easy *)conn_local,false),
     data_local._4_4_ = local_34, local_34 == CURLE_OK)) {
    pcStack_20->httpversion = '\x14';
    pcStack_20->bits = (ConnectBits)((uint)pcStack_20->bits & 0xff7fffff | 0x800000);
    pcStack_20->bundle->multiuse = 2;
    Curl_multi_connchanged((Curl_multi *)(conn_local->socks_proxy).passwd);
    if (pCStack_30->next == (Curl_cfilter *)0x0) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      data_local._4_4_ = Curl_conn_cf_connect(pCStack_30,(Curl_easy *)conn_local,false,&local_35);
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http2_switch(struct Curl_easy *data,
                           struct connectdata *conn, int sockindex)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  DEBUGASSERT(!Curl_conn_is_http2(data, conn, sockindex));
  DEBUGF(infof(data, "switching to HTTP/2"));

  result = http2_cfilter_add(&cf, data, conn, sockindex);
  if(result)
    return result;

  result = cf_h2_ctx_init(cf, data, FALSE);
  if(result)
    return result;

  conn->httpversion = 20; /* we know we're on HTTP/2 now */
  conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  Curl_multi_connchanged(data->multi);

  if(cf->next) {
    bool done;
    return Curl_conn_cf_connect(cf, data, FALSE, &done);
  }
  return CURLE_OK;
}